

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarseparator.cpp
# Opt level: O1

void __thiscall QToolBarSeparator::paintEvent(QToolBarSeparator *this,QPaintEvent *param_1)

{
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QPainter p;
  QStyleOption opt;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QPalettePrivate *pQStack_30;
  undefined1 *local_28;
  QObject *pQStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_60,(QPaintDevice *)(this + 0x10));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_58,1,0);
  QStyleOption::initFrom((QStyleOption *)&local_58,(QWidget *)this);
  if (*(int *)(this + 0x28) == 1) {
    puStack_50 = (undefined1 *)((ulong)puStack_50 | 0x80);
  }
  pQVar1 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar1 + 0xb0))
            (pQVar1,0x25,(QStyleOption *)&local_58,(QPainter *)&local_60,
             *(undefined8 *)(*(long *)(this + 8) + 0x10));
  QStyleOption::~QStyleOption((QStyleOption *)&local_58);
  QPainter::~QPainter((QPainter *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarSeparator::paintEvent(QPaintEvent *)
{
    QPainter p(this);
    QStyleOption opt;
    initStyleOption(&opt);
    style()->drawPrimitive(QStyle::PE_IndicatorToolBarSeparator, &opt, &p, parentWidget());
}